

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_METAL_MOVA(Context *ctx)

{
  uint uVar1;
  char local_d8 [8];
  char code [128];
  char src0 [64];
  int vecsize;
  Context *ctx_local;
  
  uVar1 = vecsize_from_writemask((ctx->dest_arg).writemask);
  make_METAL_srcarg_string_masked(ctx,0,code + 0x78,0x40);
  ctx->metal_need_header_math = 1;
  ctx->metal_need_header_common = 1;
  if (uVar1 == 1) {
    make_METAL_destarg_assign
              (ctx,local_d8,0x80,"int(floor(abs(%s) + 0.5) * sign(%s))",code + 0x78,code + 0x78);
  }
  else {
    make_METAL_destarg_assign
              (ctx,local_d8,0x80,"int%d(floor(abs(%s) + float%d(0.5)) * sign(%s))",(ulong)uVar1,
               code + 0x78,uVar1,code + 0x78);
  }
  output_line(ctx,"%s",local_d8);
  return;
}

Assistant:

static void emit_METAL_MOVA(Context *ctx)
{
    const int vecsize = vecsize_from_writemask(ctx->dest_arg.writemask);
    char src0[64]; make_METAL_srcarg_string_masked(ctx, 0, src0, sizeof (src0));
    char code[128];

    ctx->metal_need_header_math = 1;
    ctx->metal_need_header_common = 1;

    if (vecsize == 1)
    {
        make_METAL_destarg_assign(ctx, code, sizeof (code),
                                 "int(floor(abs(%s) + 0.5) * sign(%s))",
                                 src0, src0);
    } // if

    else
    {
        make_METAL_destarg_assign(ctx, code, sizeof (code),
                            "int%d(floor(abs(%s) + float%d(0.5)) * sign(%s))",
                            vecsize, src0, vecsize, src0);
    } // else

    output_line(ctx, "%s", code);
}